

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O3

void __thiscall deqp::egl::ResizeTest::deinit(ResizeTest *this)

{
  NativeWindow *pNVar1;
  Library *pLVar2;
  
  if (this->m_display != (EGLDisplay)0x0) {
    pLVar2 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
    (*pLVar2->_vptr_Library[0x34])(pLVar2,this->m_display);
  }
  this->m_display = (EGLDisplay)0x0;
  this->m_config = (EGLConfig)0x0;
  de::details::UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>::reset
            (&(this->m_context).
              super_UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>);
  de::details::UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::reset
            (&(this->m_surface).
              super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>);
  pNVar1 = (this->m_nativeWindow).
           super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.ptr;
  if (pNVar1 != (NativeWindow *)0x0) {
    (*pNVar1->_vptr_NativeWindow[1])();
    (this->m_nativeWindow).
    super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.ptr =
         (NativeWindow *)0x0;
  }
  return;
}

Assistant:

void ResizeTest::deinit (void)
{
	if (m_display != EGL_NO_DISPLAY)
		m_eglTestCtx.getLibrary().terminate(m_display);

	m_config		= DE_NULL;
	m_display		= EGL_NO_DISPLAY;
	m_context.clear();
	m_surface.clear();
	m_nativeWindow.clear();
}